

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

SceneLight * __thiscall
CGL::Application::init_light(Application *this,LightInfo *light,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  AreaLight *this_00;
  
  switch(light->light_type) {
  case AMBIENT:
    this_00 = (AreaLight *)operator_new(0x30);
    (this_00->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_002a5830;
    dVar1 = (light->spectrum).field_0.field_0.y;
    dVar2 = (light->spectrum).field_0.field_0.z;
    uVar3 = *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18);
    (this_00->spectrum).field_0.field_0.x = (light->spectrum).field_0.field_0.x;
    (this_00->spectrum).field_0.field_0.y = dVar1;
    (this_00->spectrum).field_0.field_0.z = dVar2;
    *(undefined8 *)((long)&(this_00->spectrum).field_0 + 0x18) = uVar3;
    break;
  case DIRECTIONAL:
    this_00 = (AreaLight *)operator_new(0x70);
    GLScene::DirectionalLight::DirectionalLight((DirectionalLight *)this_00,light,transform);
    break;
  case AREA:
    this_00 = (AreaLight *)operator_new(0xb0);
    GLScene::AreaLight::AreaLight(this_00,light,transform);
    break;
  case POINT:
    this_00 = (AreaLight *)operator_new(0x50);
    GLScene::PointLight::PointLight((PointLight *)this_00,light,transform);
    break;
  case SPOT:
    this_00 = (AreaLight *)operator_new(0x70);
    GLScene::SpotLight::SpotLight((SpotLight *)this_00,light,transform);
    break;
  default:
    this_00 = (AreaLight *)0x0;
  }
  return &this_00->super_SceneLight;
}

Assistant:

GLScene::SceneLight *Application::init_light(LightInfo& light,
                                        const Matrix4x4& transform) {
  switch(light.light_type) {
    case Collada::LightType::NONE:
      break;
    case Collada::LightType::AMBIENT:
      return new GLScene::AmbientLight(light);
    case Collada::LightType::DIRECTIONAL:
      return new GLScene::DirectionalLight(light, transform);
    case Collada::LightType::AREA:
      return new GLScene::AreaLight(light, transform);
    case Collada::LightType::POINT:
      return new GLScene::PointLight(light, transform);
    case Collada::LightType::SPOT:
      return new GLScene::SpotLight(light, transform);
    default:
      break;
  }
  return nullptr;
}